

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DGXMLScanner::cleanUp(DGXMLScanner *this)

{
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *this_00;
  NameIdPool<xercesc_4_0::DTDElementDecl> *this_01;
  RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this_02;
  Hash2KeysSetOf<xercesc_4_0::StringHasher> *this_03;
  XMLAttr **in_RSI;
  
  this_00 = this->fAttrNSList;
  if (this_00 != (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)0x0) {
    in_RSI = this_00->fElemList;
    (*this_00->fMemoryManager->_vptr_MemoryManager[4])();
    XMemory::operator_delete((XMemory *)this_00,in_RSI);
  }
  if (this->fDTDValidator != (DTDValidator *)0x0) {
    (*(this->fDTDValidator->super_XMLValidator)._vptr_XMLValidator[1])();
  }
  this_01 = this->fDTDElemNonDeclPool;
  if (this_01 != (NameIdPool<xercesc_4_0::DTDElementDecl> *)0x0) {
    NameIdPool<xercesc_4_0::DTDElementDecl>::~NameIdPool(this_01);
    XMemory::operator_delete((XMemory *)this_01,in_RSI);
  }
  this_02 = this->fAttDefRegistry;
  if (this_02 != (RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *)0x0) {
    RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::~RefHashTableOf(this_02);
    XMemory::operator_delete((XMemory *)this_02,in_RSI);
  }
  this_03 = this->fUndeclaredAttrRegistry;
  if (this_03 != (Hash2KeysSetOf<xercesc_4_0::StringHasher> *)0x0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::~Hash2KeysSetOf(this_03);
    XMemory::operator_delete((XMemory *)this_03,in_RSI);
    return;
  }
  return;
}

Assistant:

void DGXMLScanner::cleanUp()
{
    delete fAttrNSList;
    delete fDTDValidator;
    delete fDTDElemNonDeclPool;
    delete fAttDefRegistry;
    delete fUndeclaredAttrRegistry;
}